

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::DepthDrawCase::iterate(DepthDrawCase *this)

{
  ostringstream *poVar1;
  float fVar2;
  BBoxState BVar3;
  pointer pLVar4;
  RenderContext *context;
  int y;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  TestLog *pTVar9;
  TestError *this_00;
  void *__n;
  ConstPixelBufferAccess *pCVar10;
  LogImageSet *access;
  int x;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  bool bVar11;
  undefined4 uVar12;
  long lVar13;
  int layerNdx;
  long lVar14;
  char *description;
  float fVar15;
  float fVar16;
  allocator<char> local_482;
  allocator<char> local_481;
  allocator<char> local_480;
  allocator<char> local_47f;
  allocator<char> local_47e;
  allocator<char> local_47d;
  float local_47c;
  int local_478;
  int local_474;
  int local_470;
  int local_46c;
  Surface viewport;
  Surface errorMask;
  string local_438;
  string local_418;
  Random rnd;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  ConstPixelBufferAccess local_368;
  ConstPixelBufferAccess local_340;
  LogImageSet local_318;
  LogImage local_2d8;
  LogImage local_240;
  undefined1 local_1b0 [384];
  long lVar8;
  
  BVar3 = this->m_state;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  iVar5 = (**(code **)(lVar8 + 0x780))
                    ((((this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       .m_data.ptr)->m_program).m_program,"a_position");
  iVar6 = (**(code **)(lVar8 + 0x780))
                    ((((this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       .m_data.ptr)->m_program).m_program,"a_colorMix");
  local_46c = (**(code **)(lVar8 + 0xb48))
                        ((((this->m_program).
                           super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                           .m_data.ptr)->m_program).m_program,"u_depthBias");
  local_470 = (**(code **)(lVar8 + 0xb48))
                        ((((this->m_program).
                           super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                           .m_data.ptr)->m_program).m_program,"u_depthScale");
  local_474 = (**(code **)(lVar8 + 0xb48))
                        ((((this->m_program).
                           super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                           .m_data.ptr)->m_program).m_program,"u_color1");
  local_478 = (**(code **)(lVar8 + 0xb48))
                        ((((this->m_program).
                           super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                           .m_data.ptr)->m_program).m_program,"u_color2");
  tcu::Surface::Surface(&viewport,0x100,0x100);
  deRandom_init(&rnd.m_rnd,0x213237);
  if (iVar5 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"posLocation != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
               ,0xf04);
  }
  else if (iVar6 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"colLocation != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
               ,0xf05);
  }
  else if (local_46c == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"depthBiasLocation != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
               ,0xf06);
  }
  else if (local_470 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"depthScaleLocation != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
               ,0xf07);
  }
  else if (local_474 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"color1Location != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
               ,0xf08);
  }
  else {
    if (local_478 != -1) {
      (**(code **)(lVar8 + 0x1a00))(0,0,0x100,0x100);
      (**(code **)(lVar8 + 0x1c0))(0,0,0,0x3f800000);
      (**(code **)(lVar8 + 0x1d0))(0x3f800000);
      (**(code **)(lVar8 + 0x4a0))(0x201);
      (**(code **)(lVar8 + 0x5e0))(0xb71);
      (**(code **)(lVar8 + 0x188))(0x4100);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"setup viewport",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0xf11);
      (**(code **)(lVar8 + 0x40))
                (0x8892,(((this->m_vbo).
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                          .m_data.ptr)->super_ObjectWrapper).m_object);
      (**(code **)(lVar8 + 0x19f0))(iVar5,4,0x1406,0,0x20,0);
      uVar12 = 4;
      (**(code **)(lVar8 + 0x19f0))(iVar6,4,0x1406,0,0x20,0x10);
      (**(code **)(lVar8 + 0x610))(iVar5);
      (**(code **)(lVar8 + 0x610))(iVar6);
      (**(code **)(lVar8 + 0x1680))
                ((((this->m_program).
                   super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                   m_data.ptr)->m_program).m_program);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"setup va",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0xf19);
      if (BVar3 == STATE_PER_PRIMITIVE) {
        (**(code **)(lVar8 + 0xfd8))(0x8e72,3);
        uVar12 = 0xe;
      }
      lVar13 = 0x18;
      for (lVar14 = 0; lVar14 < this->m_numLayers; lVar14 = lVar14 + 1) {
        (**(code **)(lVar8 + 0x14e0))
                  (*(undefined4 *)
                    ((long)(&((this->m_layers).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start)->color1 + -2) + lVar13),
                   local_46c);
        (**(code **)(lVar8 + 0x14e0))
                  (*(undefined4 *)
                    ((long)(((this->m_layers).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start)->color1).m_data +
                    lVar13 + -0x1c),local_470);
        (**(code **)(lVar8 + 0x15a8))
                  (local_474,1,
                   (long)(&((this->m_layers).
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start)->color1 + -2) + 8 + lVar13);
        (**(code **)(lVar8 + 0x15a8))
                  (local_478,1,
                   (long)(((this->m_layers).
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start)->color1).m_data + lVar13 + -8)
        ;
        if (this->m_state == STATE_GLOBAL) {
          if (this->m_bboxSize == BBOX_EQUAL) {
            fVar16 = 0.0;
            fVar15 = 0.0;
          }
          else {
            fVar15 = deRandom_getFloat(&rnd.m_rnd);
            fVar15 = fVar15 * 0.3;
            local_47c = fVar15;
            if (this->m_bboxSize == BBOX_EQUAL) {
              fVar16 = 0.0;
            }
            else {
              fVar16 = deRandom_getFloat(&rnd.m_rnd);
              fVar16 = fVar16 * 0.3;
              fVar15 = local_47c;
            }
          }
          pLVar4 = (this->m_layers).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          fVar2 = *(float *)((long)(&pLVar4->color1 + -2) + lVar13);
          (**(code **)(lVar8 + 0x1040))
                    (0xbf800000,0xbf800000,fVar2 - fVar15,0x3f800000,0x3f800000,0x3f800000,
                     fVar2 + *(float *)((long)(pLVar4->color1).m_data + lVar13 + -0x1c) + fVar16,
                     0x3f800000);
        }
        (**(code **)(lVar8 + 0x538))(uVar12,0,this->m_gridSize * this->m_gridSize * 6);
        lVar13 = lVar13 + 0x28;
      }
      context = ((this->super_TestCase).m_context)->m_renderCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&viewport);
      glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      __n = (void *)0xf32;
      glu::checkError(dVar7,"render and read",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0xf32);
      tcu::Surface::Surface(&errorMask,viewport.m_width,viewport.m_height);
      tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&errorMask);
      local_2d8.m_name._M_dataplus._M_p = (pointer)0x0;
      local_2d8.m_name._M_string_length = 0xff00000000;
      tcu::clear((PixelBufferAccess *)local_1b0,(IVec4 *)&local_2d8);
      bVar11 = false;
      for (iVar5 = 0; iVar5 < viewport.m_height; iVar5 = iVar5 + 1) {
        for (iVar6 = 0; iVar6 < viewport.m_width; iVar6 = iVar6 + 1) {
          if (*(short *)((long)viewport.m_pixels.m_ptr +
                        (long)(viewport.m_width * iVar5 + iVar6) * 4 + 1) != 0xff) {
            *(undefined4 *)
             ((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * iVar5 + iVar6) * 4) =
                 0xff0000ff;
            bVar11 = true;
          }
        }
        __n = viewport.m_pixels.m_ptr;
      }
      if (bVar11) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Image verification failed.");
        pTVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"Images",&local_47d)
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_438,"Image verification",&local_47e);
        tcu::LogImageSet::LogImageSet(&local_318,&local_418,&local_438);
        iVar5 = (int)pTVar9;
        tcu::LogImageSet::write(&local_318,iVar5,__buf,(size_t)__n);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_388,"Viewport",&local_47f);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,"Viewport contents",&local_480);
        tcu::Surface::getAccess(&local_340,&viewport);
        pCVar10 = &local_340;
        tcu::LogImage::LogImage
                  (&local_2d8,&local_388,&local_3a8,pCVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_2d8,iVar5,__buf_00,(size_t)pCVar10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"ErrorMask",&local_481);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3e8,"Error mask",&local_482);
        tcu::Surface::getAccess((PixelBufferAccess *)&local_368,&errorMask);
        pCVar10 = &local_368;
        tcu::LogImage::LogImage
                  (&local_240,&local_3c8,&local_3e8,pCVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_240,iVar5,__buf_01,(size_t)pCVar10);
        tcu::TestLog::endImageSet(pTVar9);
        tcu::LogImage::~LogImage(&local_240);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::string::~string((string *)&local_3c8);
        tcu::LogImage::~LogImage(&local_2d8);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_388);
        tcu::LogImageSet::~LogImageSet(&local_318);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        description = "Image verification failed";
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Result image ok.");
        pTVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_340,"Images",(allocator<char> *)&local_388);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_368,"Image verification",(allocator<char> *)&local_3a8);
        tcu::LogImageSet::LogImageSet
                  ((LogImageSet *)&local_240,(string *)&local_340,(string *)&local_368);
        tcu::LogImageSet::write((LogImageSet *)&local_240,(int)pTVar9,__buf_02,(size_t)__n);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_418,"Viewport",(allocator<char> *)&local_3c8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_438,"Viewport contents",(allocator<char> *)&local_3e8);
        tcu::Surface::getAccess((ConstPixelBufferAccess *)&local_318,&viewport);
        access = &local_318;
        tcu::LogImage::LogImage
                  (&local_2d8,&local_418,&local_438,(ConstPixelBufferAccess *)access,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_2d8,(int)pTVar9,__buf_03,(size_t)access);
        tcu::TestLog::endImageSet(pTVar9);
        tcu::LogImage::~LogImage(&local_2d8);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_418);
        tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_240);
        std::__cxx11::string::~string((string *)&local_368);
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        description = "Pass";
      }
      tcu::Surface::~Surface(&errorMask);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar11,
                 description);
      tcu::Surface::~Surface(&viewport);
      return STOP;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"color2Location != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
               ,0xf09);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

DepthDrawCase::IterateResult DepthDrawCase::iterate (void)
{
	const bool				hasTessellation		= (m_state == STATE_PER_PRIMITIVE);
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const glw::GLint		posLocation			= gl.getAttribLocation(m_program->getProgram(), "a_position");
	const glw::GLint		colLocation			= gl.getAttribLocation(m_program->getProgram(), "a_colorMix");
	const glw::GLint		depthBiasLocation	= gl.getUniformLocation(m_program->getProgram(), "u_depthBias");
	const glw::GLint		depthScaleLocation	= gl.getUniformLocation(m_program->getProgram(), "u_depthScale");
	const glw::GLint		color1Location		= gl.getUniformLocation(m_program->getProgram(), "u_color1");
	const glw::GLint		color2Location		= gl.getUniformLocation(m_program->getProgram(), "u_color2");

	tcu::Surface			viewport			(RENDER_AREA_SIZE, RENDER_AREA_SIZE);
	de::Random				rnd					(0x213237);

	TCU_CHECK(posLocation != -1);
	TCU_CHECK(colLocation != -1);
	TCU_CHECK(depthBiasLocation != -1);
	TCU_CHECK(depthScaleLocation != -1);
	TCU_CHECK(color1Location != -1);
	TCU_CHECK(color2Location != -1);

	gl.viewport(0, 0, RENDER_AREA_SIZE, RENDER_AREA_SIZE);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clearDepthf(1.0f);
	gl.depthFunc(GL_LESS);
	gl.enable(GL_DEPTH_TEST);
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "setup viewport");

	gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, (int)(8 * sizeof(float)), (const float*)DE_NULL);
	gl.vertexAttribPointer(colLocation, 4, GL_FLOAT, GL_FALSE, (int)(8 * sizeof(float)), (const float*)DE_NULL + 4);
	gl.enableVertexAttribArray(posLocation);
	gl.enableVertexAttribArray(colLocation);
	gl.useProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "setup va");

	if (hasTessellation)
		gl.patchParameteri(GL_PATCH_VERTICES, 3);

	for (int layerNdx = 0; layerNdx < m_numLayers; ++layerNdx)
	{
		gl.uniform1f(depthBiasLocation, m_layers[layerNdx].zOffset);
		gl.uniform1f(depthScaleLocation, m_layers[layerNdx].zScale);
		gl.uniform4fv(color1Location, 1, m_layers[layerNdx].color1.getPtr());
		gl.uniform4fv(color2Location, 1, m_layers[layerNdx].color2.getPtr());

		if (m_state == STATE_GLOBAL)
		{
			const float negPadding = (m_bboxSize == BBOX_EQUAL) ? (0.0f) : (rnd.getFloat() * 0.3f);
			const float posPadding = (m_bboxSize == BBOX_EQUAL) ? (0.0f) : (rnd.getFloat() * 0.3f);

			gl.primitiveBoundingBox(-1.0f, -1.0f, m_layers[layerNdx].zOffset - negPadding, 1.0f,
									1.0f,  1.0f, (m_layers[layerNdx].zOffset + m_layers[layerNdx].zScale + posPadding), 1.0f);
		}

		gl.drawArrays((hasTessellation) ? (GL_PATCHES) : (GL_TRIANGLES), 0, m_gridSize * m_gridSize * 6);
	}

	glu::readPixels(m_context.getRenderContext(), 0, 0, viewport.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "render and read");

	if (verifyImage(viewport))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

	return STOP;
}